

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fAttribLocationTests.cpp
# Opt level: O3

TestCaseGroup * deqp::gles3::Functional::createAttributeLocationTests(Context *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestCaseGroup *this;
  TestNode *pTVar4;
  BindAttributeTest *this_00;
  BindMaxAttributesTest *this_01;
  BindAliasingAttributeTest *pBVar5;
  BindMaxAliasingAttributeTest *this_02;
  BindInactiveAliasingAttributeTest *this_03;
  BindHoleAttributeTest *this_04;
  PreAttachBindAttributeTest *this_05;
  PreLinkBindAttributeTest *this_06;
  PostLinkBindAttributeTest *this_07;
  BindRelinkAttributeTest *this_08;
  BindReattachAttributeTest *this_09;
  LocationAttributeTest *this_10;
  LocationMaxAttributesTest *this_11;
  LocationHoleAttributeTest *this_12;
  MixedAttributeTest *this_13;
  MixedMaxAttributesTest *this_14;
  PreAttachMixedAttributeTest *this_15;
  PreLinkMixedAttributeTest *this_16;
  PostLinkMixedAttributeTest *this_17;
  MixedRelinkAttributeTest *this_18;
  MixedReattachAttributeTest *this_19;
  MixedHoleAttributeTest *this_20;
  BindRelinkHoleAttributeTest *this_21;
  MixedRelinkHoleAttributeTest *this_22;
  AttribType *type;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  string local_6f8;
  string local_6d8;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  AttribType local_518 [4];
  AttribType local_478;
  AttribType local_450;
  AttribType local_428;
  AttribType local_3f8 [4];
  AttribType local_358;
  AttribType local_330;
  AttribType local_308;
  AttribType local_2e0;
  AttribType local_2b8;
  AttribType local_290;
  AttribType local_268;
  AttribType local_240;
  AttribType local_218;
  AttribType local_1f0;
  AttribType local_1c8;
  AttribType local_1a0;
  AttribType local_178;
  AttribType local_150;
  AttribType local_128;
  AttribType local_100;
  AttribType local_d8;
  AttribType local_b0;
  AttribType local_88;
  AttribType local_60;
  
  local_518[0].m_name._M_dataplus._M_p = (pointer)&local_518[0].m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"float","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType
            (local_3f8,&local_518[0].m_name,1,0x1406);
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"vec2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_3f8 + 1,&local_738,1,0x8b50);
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"vec3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_3f8 + 2,&local_758,1,0x8b51);
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"vec4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_3f8 + 3,&local_778,1,0x8b52);
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"mat2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_358,&local_798,2,0x8b5a);
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"mat3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_330,&local_7b8,3,0x8b5b);
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"mat4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_308,&local_7d8,4,0x8b5c);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"int","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_2e0,&local_7f8,1,0x1404);
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"ivec2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_2b8,&local_5b8,1,0x8b53);
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"ivec3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_290,&local_5d8,1,0x8b54);
  local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"ivec4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_268,&local_5f8,1,0x8b55);
  local_618._M_dataplus._M_p = (pointer)&local_618.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_618,"uint","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_240,&local_618,1,0x1405);
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"uvec2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_218,&local_638,1,0x8dc6);
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_658,"uvec3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_1f0,&local_658,1,0x8dc7);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"uvec4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_1c8,&local_678,1,0x8dc8);
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_698,"mat2x2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_1a0,&local_698,2,0x8b5a);
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b8,"mat2x3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_178,&local_6b8,2,0x8b65);
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"mat2x4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_150,&local_6d8,2,0x8b66);
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"mat3x2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_128,&local_6f8,3,0x8b67);
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"mat3x3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_100,&local_718,3,0x8b5b);
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"mat3x4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_d8,&local_538,3,0x8b68);
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"mat4x2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_b0,&local_558,4,0x8b69);
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"mat4x3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_88,&local_578,4,0x8b6a);
  local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"mat4x4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_60,&local_598,4,0x8b5c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  paVar7 = &local_738.field_2;
  paVar2 = &local_758.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_778.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_798.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != paVar1) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != paVar3) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != paVar2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != paVar7) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518[0].m_name._M_dataplus._M_p != &local_518[0].m_name.field_2) {
    operator_delete(local_518[0].m_name._M_dataplus._M_p,
                    local_518[0].m_name.field_2._M_allocated_capacity + 1);
  }
  local_738._M_dataplus._M_p = (pointer)paVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_738,"float","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_518,&local_738,1,0x1406);
  local_758._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_758,"vec2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_518 + 1,&local_758,1,0x8b50);
  local_778._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"vec3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_518 + 2,&local_778,1,0x8b51);
  local_798._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_798,"vec4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(local_518 + 3,&local_798,1,0x8b52);
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"mat2","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_478,&local_7b8,2,0x8b5a);
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"mat3","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_450,&local_7d8,3,0x8b5b);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f8,"mat4","");
  deqp::gls::AttributeLocationTestUtil::AttribType::AttribType(&local_428,&local_7f8,4,0x8b5c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,local_7f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,local_7d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != paVar1) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != paVar3) {
    operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != paVar2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != paVar7) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  this = (TestCaseGroup *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,context->m_testCtx,"attribute_location",
             "Attribute location tests");
  (this->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  this->m_context = context;
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"bind",
             "Basic bind attribute location tests.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_00 = (BindAttributeTest *)operator_new(0xa8);
    deqp::gls::BindAttributeTest::BindAttributeTest
              (this_00,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_00);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"bind_max_attributes",
             "Use bind with maximum number of attributes.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_01 = (BindMaxAttributesTest *)operator_new(0xa8);
    deqp::gls::BindMaxAttributesTest::BindMaxAttributesTest
              (this_01,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_01);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"bind_aliasing",
             "Test binding aliasing locations.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    pBVar5 = (BindAliasingAttributeTest *)operator_new(0xa8);
    type = (AttribType *)((long)&local_518[0].m_name._M_dataplus._M_p + lVar6);
    deqp::gls::BindAliasingAttributeTest::BindAliasingAttributeTest
              (pBVar5,context->m_testCtx,context->m_renderCtx,type,0,-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
    if (1 < *(uint *)((long)&local_518[0].m_locationSize + lVar6)) {
      pBVar5 = (BindAliasingAttributeTest *)operator_new(0xa8);
      deqp::gls::BindAliasingAttributeTest::BindAliasingAttributeTest
                (pBVar5,context->m_testCtx,context->m_renderCtx,type,1,-1);
      tcu::TestNode::addChild(pTVar4,(TestNode *)pBVar5);
    }
    this_02 = (BindMaxAliasingAttributeTest *)operator_new(0xa8);
    deqp::gls::BindMaxAliasingAttributeTest::BindMaxAliasingAttributeTest
              (this_02,context->m_testCtx,context->m_renderCtx,type,-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_02);
    this_03 = (BindInactiveAliasingAttributeTest *)operator_new(0xa8);
    deqp::gls::BindInactiveAliasingAttributeTest::BindInactiveAliasingAttributeTest
              (this_03,context->m_testCtx,context->m_renderCtx,type,-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_03);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x118);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"bind_hole",
             "Bind all, but one attribute and leave hole in location space for it.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_04 = (BindHoleAttributeTest *)operator_new(0xa8);
    deqp::gls::BindHoleAttributeTest::BindHoleAttributeTest
              (this_04,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_04);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"bind_time",
             "Bind time tests. Test binding at different stages.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  this_05 = (PreAttachBindAttributeTest *)operator_new(0x78);
  deqp::gls::PreAttachBindAttributeTest::PreAttachBindAttributeTest
            (this_05,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_05);
  this_06 = (PreLinkBindAttributeTest *)operator_new(0x78);
  deqp::gls::PreLinkBindAttributeTest::PreLinkBindAttributeTest
            (this_06,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_06);
  this_07 = (PostLinkBindAttributeTest *)operator_new(0x78);
  deqp::gls::PostLinkBindAttributeTest::PostLinkBindAttributeTest
            (this_07,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_07);
  this_08 = (BindRelinkAttributeTest *)operator_new(0x78);
  deqp::gls::BindRelinkAttributeTest::BindRelinkAttributeTest
            (this_08,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_08);
  this_09 = (BindReattachAttributeTest *)operator_new(0x78);
  deqp::gls::BindReattachAttributeTest::BindReattachAttributeTest
            (this_09,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_09);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"layout","Basic layout location tests.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_10 = (LocationAttributeTest *)operator_new(0xa8);
    deqp::gls::LocationAttributeTest::LocationAttributeTest
              (this_10,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_10);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"layout_max_attributes",
             "Maximum attributes used with layout location qualifiers.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_11 = (LocationMaxAttributesTest *)operator_new(0xa8);
    deqp::gls::LocationMaxAttributesTest::LocationMaxAttributesTest
              (this_11,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_11);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"layout_hole",
             "Define layout location for all, but one attribute consuming max attribute locations.")
  ;
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_12 = (LocationHoleAttributeTest *)operator_new(0xa8);
    deqp::gls::LocationHoleAttributeTest::LocationHoleAttributeTest
              (this_12,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_12);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"mixed","Basic mixed location tests.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_13 = (MixedAttributeTest *)operator_new(0xa8);
    deqp::gls::MixedAttributeTest::MixedAttributeTest
              (this_13,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_13);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"mixed_max_attributes",
             "Maximum attributes used with mixed binding and layout qualifiers.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_14 = (MixedMaxAttributesTest *)operator_new(0xa8);
    deqp::gls::MixedMaxAttributesTest::MixedMaxAttributesTest
              (this_14,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_14);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"mixed_time",
             "Bind time tests. Test binding at different stages.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  this_15 = (PreAttachMixedAttributeTest *)operator_new(0x78);
  deqp::gls::PreAttachMixedAttributeTest::PreAttachMixedAttributeTest
            (this_15,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_15);
  this_16 = (PreLinkMixedAttributeTest *)operator_new(0x78);
  deqp::gls::PreLinkMixedAttributeTest::PreLinkMixedAttributeTest
            (this_16,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_16);
  this_17 = (PostLinkMixedAttributeTest *)operator_new(0x78);
  deqp::gls::PostLinkMixedAttributeTest::PostLinkMixedAttributeTest
            (this_17,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_17);
  this_18 = (MixedRelinkAttributeTest *)operator_new(0x78);
  deqp::gls::MixedRelinkAttributeTest::MixedRelinkAttributeTest
            (this_18,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_18);
  this_19 = (MixedReattachAttributeTest *)operator_new(0x78);
  deqp::gls::MixedReattachAttributeTest::MixedReattachAttributeTest
            (this_19,context->m_testCtx,context->m_renderCtx);
  tcu::TestNode::addChild(pTVar4,(TestNode *)this_19);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"mixed_hole",
             "Use layout location qualifiers and binding. Leave hole in location space for only free attribute."
            );
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_20 = (MixedHoleAttributeTest *)operator_new(0xa8);
    deqp::gls::MixedHoleAttributeTest::MixedHoleAttributeTest
              (this_20,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_20);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"bind_relink_hole",
             "Test relinking with moving hole in attribute location space.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_21 = (BindRelinkHoleAttributeTest *)operator_new(0xa8);
    deqp::gls::BindRelinkHoleAttributeTest::BindRelinkHoleAttributeTest
              (this_21,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_21);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  pTVar4 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,context->m_testCtx,"mixed_relink_hole",
             "Test relinking with moving hole in attribute location space.");
  pTVar4->_vptr_TestNode = (_func_int **)&PTR__TestCase_02139700;
  pTVar4[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  lVar6 = 0;
  do {
    this_22 = (MixedRelinkHoleAttributeTest *)operator_new(0xa8);
    deqp::gls::MixedRelinkHoleAttributeTest::MixedRelinkHoleAttributeTest
              (this_22,context->m_testCtx,context->m_renderCtx,
               (AttribType *)((long)&local_3f8[0].m_name._M_dataplus._M_p + lVar6),-1);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_22);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0x3c0);
  lVar6 = -0x118;
  paVar7 = &local_428.m_name.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -5);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0);
  lVar6 = -0x3c0;
  paVar7 = &local_60.m_name.field_2;
  do {
    if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar7->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar7->_M_allocated_capacity)[-2],paVar7->_M_allocated_capacity + 1
                     );
    }
    paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar7->_M_allocated_capacity + -5);
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0);
  return this;
}

Assistant:

TestCaseGroup* createAttributeLocationTests	(Context& context)
{
	const AttribType	types[] =
	{
		AttribType("float",		1,  GL_FLOAT),
		AttribType("vec2",		1,  GL_FLOAT_VEC2),
		AttribType("vec3",		1,  GL_FLOAT_VEC3),
		AttribType("vec4",		1,  GL_FLOAT_VEC4),

		AttribType("mat2",		2,  GL_FLOAT_MAT2),
		AttribType("mat3",		3,  GL_FLOAT_MAT3),
		AttribType("mat4",		4,  GL_FLOAT_MAT4),

		AttribType("int",		1,	GL_INT),
		AttribType("ivec2",		1,	GL_INT_VEC2),
		AttribType("ivec3",		1,	GL_INT_VEC3),
		AttribType("ivec4",		1,	GL_INT_VEC4),

		AttribType("uint",		1,	GL_UNSIGNED_INT),
		AttribType("uvec2",		1,	GL_UNSIGNED_INT_VEC2),
		AttribType("uvec3",		1,	GL_UNSIGNED_INT_VEC3),
		AttribType("uvec4",		1,	GL_UNSIGNED_INT_VEC4),

		AttribType("mat2x2",	2,	GL_FLOAT_MAT2),
		AttribType("mat2x3",	2,	GL_FLOAT_MAT2x3),
		AttribType("mat2x4",	2,	GL_FLOAT_MAT2x4),

		AttribType("mat3x2",	3,	GL_FLOAT_MAT3x2),
		AttribType("mat3x3",	3,	GL_FLOAT_MAT3),
		AttribType("mat3x4",	3,	GL_FLOAT_MAT3x4),

		AttribType("mat4x2",	4,	GL_FLOAT_MAT4x2),
		AttribType("mat4x3",	4,	GL_FLOAT_MAT4x3),
		AttribType("mat4x4",	4,	GL_FLOAT_MAT4)
	};

	const AttribType	es2Types[] =
	{
		AttribType("float",	1,  GL_FLOAT),
		AttribType("vec2",	1,  GL_FLOAT_VEC2),
		AttribType("vec3",	1,  GL_FLOAT_VEC3),
		AttribType("vec4",	1,  GL_FLOAT_VEC4),

		AttribType("mat2",	2,  GL_FLOAT_MAT2),
		AttribType("mat3",	3,  GL_FLOAT_MAT3),
		AttribType("mat4",	4,  GL_FLOAT_MAT4)
	};

	TestCaseGroup* const root = new TestCaseGroup (context, "attribute_location", "Attribute location tests");

	// Basic bind attribute tests
	{
		TestCaseGroup* const bindAttributeGroup = new TestCaseGroup(context, "bind", "Basic bind attribute location tests.");

		root->addChild(bindAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			bindAttributeGroup->addChild(new gls::BindAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Bind max number of attributes
	{
		TestCaseGroup* const bindMaxAttributeGroup = new TestCaseGroup(context, "bind_max_attributes", "Use bind with maximum number of attributes.");

		root->addChild(bindMaxAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			bindMaxAttributeGroup->addChild(new gls::BindMaxAttributesTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test aliasing
	{
		TestCaseGroup* const aliasingGroup = new TestCaseGroup(context, "bind_aliasing", "Test binding aliasing locations.");

		root->addChild(aliasingGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(es2Types); typeNdx++)
		{
			const AttribType& type = es2Types[typeNdx];

			// Simple aliasing cases
			aliasingGroup->addChild(new gls::BindAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));

			// For types which occupy more than one location. Alias second location.
			if (type.getLocationSize() > 1)
				aliasingGroup->addChild(new gls::BindAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type, 1));

			// Use more than maximum attributes with aliasing
			aliasingGroup->addChild(new gls::BindMaxAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));

			// Use more than maximum attributes but inactive
			aliasingGroup->addChild(new gls::BindInactiveAliasingAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test filling holes in attribute location
	{
		TestCaseGroup* const holeGroup = new TestCaseGroup(context, "bind_hole", "Bind all, but one attribute and leave hole in location space for it.");

		root->addChild(holeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			// Bind first location, leave hole size of type and fill rest of locations
			holeGroup->addChild(new gls::BindHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test binding at different times
	{
		TestCaseGroup* const bindTimeGroup = new TestCaseGroup(context, "bind_time", "Bind time tests. Test binding at different stages.");

		root->addChild(bindTimeGroup);

		bindTimeGroup->addChild(new gls::PreAttachBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::PreLinkBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::PostLinkBindAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::BindRelinkAttributeTest(context.getTestContext(), context.getRenderContext()));
		bindTimeGroup->addChild(new gls::BindReattachAttributeTest(context.getTestContext(), context.getRenderContext()));
	}

	// Basic layout location attribute tests
	{
		TestCaseGroup* const layoutAttributeGroup = new TestCaseGroup(context, "layout", "Basic layout location tests.");

		root->addChild(layoutAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			layoutAttributeGroup->addChild(new gls::LocationAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test max attributes with layout locations
	{
		TestCaseGroup* const layoutMaxAttributeGroup = new TestCaseGroup(context, "layout_max_attributes", "Maximum attributes used with layout location qualifiers.");

		root->addChild(layoutMaxAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			layoutMaxAttributeGroup->addChild(new gls::LocationMaxAttributesTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test filling holes in attribute location
	{
		TestCaseGroup* const holeGroup = new TestCaseGroup(context, "layout_hole", "Define layout location for all, but one attribute consuming max attribute locations.");

		root->addChild(holeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			// Location first location, leave hole size of type and fill rest of locations
			holeGroup->addChild(new gls::LocationHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Basic mixed mixed attribute tests
	{
		TestCaseGroup* const mixedAttributeGroup = new TestCaseGroup(context, "mixed", "Basic mixed location tests.");

		root->addChild(mixedAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			mixedAttributeGroup->addChild(new gls::MixedAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	{
		TestCaseGroup* const mixedMaxAttributeGroup = new TestCaseGroup(context, "mixed_max_attributes", "Maximum attributes used with mixed binding and layout qualifiers.");

		root->addChild(mixedMaxAttributeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];
			mixedMaxAttributeGroup->addChild(new gls::MixedMaxAttributesTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test mixed binding at different times
	{
		TestCaseGroup* const mixedTimeGroup = new TestCaseGroup(context, "mixed_time", "Bind time tests. Test binding at different stages.");

		root->addChild(mixedTimeGroup);

		mixedTimeGroup->addChild(new gls::PreAttachMixedAttributeTest(context.getTestContext(), context.getRenderContext()));
		mixedTimeGroup->addChild(new gls::PreLinkMixedAttributeTest(context.getTestContext(), context.getRenderContext()));
		mixedTimeGroup->addChild(new gls::PostLinkMixedAttributeTest(context.getTestContext(), context.getRenderContext()));
		mixedTimeGroup->addChild(new gls::MixedRelinkAttributeTest(context.getTestContext(), context.getRenderContext()));
		mixedTimeGroup->addChild(new gls::MixedReattachAttributeTest(context.getTestContext(), context.getRenderContext()));
	}

	{
		TestCaseGroup* const holeGroup = new TestCaseGroup(context, "mixed_hole", "Use layout location qualifiers and binding. Leave hole in location space for only free attribute.");

		root->addChild(holeGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			holeGroup->addChild(new gls::MixedHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test hole in location space that moves when relinking
	{
		TestCaseGroup* const relinkBindHoleGroup = new TestCaseGroup(context, "bind_relink_hole", "Test relinking with moving hole in attribute location space.");

		root->addChild(relinkBindHoleGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			relinkBindHoleGroup->addChild(new gls::BindRelinkHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	// Test hole in location space that moves when relinking
	{
		TestCaseGroup* const relinkMixedHoleGroup = new TestCaseGroup(context, "mixed_relink_hole", "Test relinking with moving hole in attribute location space.");

		root->addChild(relinkMixedHoleGroup);

		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(types); typeNdx++)
		{
			const AttribType& type = types[typeNdx];

			relinkMixedHoleGroup->addChild(new gls::MixedRelinkHoleAttributeTest(context.getTestContext(), context.getRenderContext(), type));
		}
	}

	return root;
}